

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_walk_inner(char *name,nni_plat_file_walker walkfn,void *arg,int flags,_Bool *stop)

{
  int iVar1;
  DIR *__dirp;
  int *piVar2;
  int local_ec;
  char *pcStack_e8;
  int walkrv;
  char *path;
  stat sbuf;
  dirent *ent;
  int rv;
  DIR *dir;
  _Bool *stop_local;
  int flags_local;
  void *arg_local;
  nni_plat_file_walker walkfn_local;
  char *name_local;
  
  __dirp = opendir(name);
  if (__dirp == (DIR *)0x0) {
    piVar2 = __errno_location();
    name_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    do {
      while( true ) {
        do {
          sbuf.__glibc_reserved[2] = (__syscall_slong_t)readdir(__dirp);
          if ((dirent *)sbuf.__glibc_reserved[2] == (dirent *)0x0) {
            closedir(__dirp);
            return 0;
          }
          iVar1 = strcmp(((dirent *)sbuf.__glibc_reserved[2])->d_name,".");
        } while ((iVar1 == 0) ||
                (iVar1 = strcmp((char *)(sbuf.__glibc_reserved[2] + 0x13),".."), iVar1 == 0));
        iVar1 = nni_asprintf(&stack0xffffffffffffff18,"%s/%s",name,sbuf.__glibc_reserved[2] + 0x13);
        if (iVar1 != 0) {
          closedir(__dirp);
          return iVar1;
        }
        iVar1 = stat(pcStack_e8,(stat *)&path);
        if (iVar1 == 0) break;
        piVar2 = __errno_location();
        if (*piVar2 != 2) {
          piVar2 = __errno_location();
          iVar1 = nni_plat_errno(*piVar2);
          nni_strfree(pcStack_e8);
          closedir(__dirp);
          return iVar1;
        }
      }
      if ((flags & 4U) == 0) {
        local_ec = (*walkfn)(pcStack_e8,arg);
      }
      else if (((uint)sbuf.st_nlink & 0xf000) == 0x8000) {
        local_ec = (*walkfn)(pcStack_e8,arg);
      }
      else {
        local_ec = 0;
      }
      if (local_ec == 1) {
        *stop = true;
      }
      if (((((*stop & 1U) == 0) && ((flags & 2U) == 0)) &&
          (((uint)sbuf.st_nlink & 0xf000) == 0x4000)) &&
         (iVar1 = nni_plat_file_walk_inner(pcStack_e8,walkfn,arg,flags,stop), iVar1 != 0)) {
        nni_strfree(pcStack_e8);
        closedir(__dirp);
        return iVar1;
      }
      nni_strfree(pcStack_e8);
    } while ((local_ec != 2) && ((*stop & 1U) == 0));
    closedir(__dirp);
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

static int
nni_plat_file_walk_inner(const char *name, nni_plat_file_walker walkfn,
    void *arg, int flags, bool *stop)
{
	DIR *dir;

	if ((dir = opendir(name)) == NULL) {
		return (nni_plat_errno(errno));
	}
	for (;;) {
		int            rv;
		struct dirent *ent;
		struct stat    sbuf;
		char *         path;
		int            walkrv;

		if ((ent = readdir(dir)) == NULL) {
			closedir(dir);
			return (0);
		}
		// Skip "." and ".."  -- we would like to skip all
		// directories, but that would require checking full
		// paths.
		if ((strcmp(ent->d_name, ".") == 0) ||
		    (strcmp(ent->d_name, "..") == 0)) {
			continue;
		}
		if ((rv = nni_asprintf(&path, "%s/%s", name, ent->d_name)) !=
		    0) {
			closedir(dir);
			return (rv);
		}
		if (stat(path, &sbuf) != 0) {
			if (errno == ENOENT) { // deleted while walking
				continue;
			}
			rv = nni_plat_errno(errno);
			nni_strfree(path);
			closedir(dir);
			return (rv);
		}
		if (flags & NNI_PLAT_FILE_WALK_FILES_ONLY) {
			if ((sbuf.st_mode & S_IFMT) == S_IFREG) {
				walkrv = walkfn(path, arg);
			} else {
				walkrv = NNI_PLAT_FILE_WALK_CONTINUE;
			}
		} else {
			walkrv = walkfn(path, arg);
		}

		if (walkrv == NNI_PLAT_FILE_WALK_STOP) {
			*stop = true;
		}

		if ((!*stop) && (rv != NNI_PLAT_FILE_WALK_PRUNE_CHILD) &&
		    ((flags & NNI_PLAT_FILE_WALK_SHALLOW) == 0) &&
		    ((sbuf.st_mode & S_IFMT) == S_IFDIR)) {
			rv = nni_plat_file_walk_inner(
			    path, walkfn, arg, flags, stop);
			if (rv != 0) {
				nni_strfree(path);
				closedir(dir);
				return (rv);
			}
		}

		nni_strfree(path);

		if ((walkrv == NNI_PLAT_FILE_WALK_PRUNE_SIB) || (*stop)) {
			break;
		}
	}
	closedir(dir);
	return (0);
}